

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dll.c
# Opt level: O0

nsync_dll_list_ nsync::nsync_dll_make_first_in_list_(nsync_dll_list_ list,nsync_dll_element_ *e)

{
  nsync_dll_element_ *e_local;
  nsync_dll_list_ list_local;
  
  e_local = list;
  if (e != (nsync_dll_element_ *)0x0) {
    if (list == (nsync_dll_list_)0x0) {
      e_local = e->prev;
    }
    else {
      nsync_dll_splice_after_(list,e);
    }
  }
  return e_local;
}

Assistant:

nsync_dll_list_ nsync_dll_make_first_in_list_ (nsync_dll_list_ list, nsync_dll_element_ *e) {
	if (e != NULL) {
		if (list == NULL) {
			list = e->prev;   /*e->prev is e_last*/
		} else {
			nsync_dll_splice_after_ (list, e);
		}
	}
	return (list);
}